

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O1

void png_safe_warning(png_structp png_nonconst_ptr,png_const_charp warning_message)

{
  png_voidp pvVar1;
  ulong uVar2;
  char cVar3;
  png_const_structrp png_ptr;
  ulong uVar4;
  
  pvVar1 = png_nonconst_ptr->error_ptr;
  if (*(int *)((long)pvVar1 + 0x20) != 0) {
    return;
  }
  if ((warning_message == (png_const_charp)0x0) || (cVar3 = *warning_message, cVar3 == '\0')) {
    uVar2 = 0;
  }
  else {
    uVar4 = 0;
    do {
      uVar2 = uVar4 + 1;
      *(char *)((long)pvVar1 + uVar4 + 0x24) = cVar3;
      if (0x3d < uVar4) break;
      cVar3 = warning_message[uVar4 + 1];
      uVar4 = uVar2;
    } while (cVar3 != '\0');
  }
  *(undefined1 *)((long)pvVar1 + uVar2 + 0x24) = 0;
  *(byte *)((long)pvVar1 + 0x20) = *(byte *)((long)pvVar1 + 0x20) | 1;
  return;
}

Assistant:

void /* PRIVATE */ PNGCBAPI
png_safe_warning(png_structp png_nonconst_ptr, png_const_charp warning_message)
{
   png_const_structrp png_ptr = png_nonconst_ptr;
   png_imagep image = png_voidcast(png_imagep, png_ptr->error_ptr);

   /* A warning is only logged if there is no prior warning or error. */
   if (image->warning_or_error == 0)
   {
      png_safecat(image->message, (sizeof image->message), 0, warning_message);
      image->warning_or_error |= PNG_IMAGE_WARNING;
   }
}